

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int findsetreg(Proto *p,int lastpc,int reg)

{
  uint uVar1;
  uint uVar2;
  OpCode OVar3;
  int dest;
  int b_1;
  int b;
  int a;
  OpCode op;
  Instruction i;
  int jmptarget;
  int setreg;
  int pc;
  int reg_local;
  int lastpc_local;
  Proto *p_local;
  
  i = 0xffffffff;
  op = OP_MOVE;
  for (jmptarget = 0; jmptarget < lastpc; jmptarget = jmptarget + 1) {
    uVar1 = p->code[jmptarget];
    uVar2 = uVar1 >> 6 & 0xff;
    switch(uVar1 & 0x3f) {
    case 4:
      if (((int)uVar2 <= reg) && (reg <= (int)(uVar2 + (uVar1 >> 0x17)))) {
        i = filterpc(jmptarget,op);
      }
      break;
    default:
      if (((luaP_opmodes[uVar1 & 0x3f] & 0x40) != 0) && (reg == uVar2)) {
        i = filterpc(jmptarget,op);
      }
      break;
    case 0x1e:
      OVar3 = jmptarget + ((uVar1 >> 0xe) - 0x1fffe);
      if (((jmptarget < (int)OVar3) && ((int)OVar3 <= lastpc)) && ((int)op < (int)OVar3)) {
        op = OVar3;
      }
      break;
    case 0x24:
    case 0x25:
      if ((int)uVar2 <= reg) {
        i = filterpc(jmptarget,op);
      }
      break;
    case 0x29:
      if ((int)(uVar2 + 2) <= reg) {
        i = filterpc(jmptarget,op);
      }
    }
  }
  return i;
}

Assistant:

static int findsetreg (Proto *p, int lastpc, int reg) {
  int pc;
  int setreg = -1;  /* keep last instruction that changed 'reg' */
  int jmptarget = 0;  /* any code before this address is conditional */
  for (pc = 0; pc < lastpc; pc++) {
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    int a = GETARG_A(i);
    switch (op) {
      case OP_LOADNIL: {
        int b = GETARG_B(i);
        if (a <= reg && reg <= a + b)  /* set registers from 'a' to 'a+b' */
          setreg = filterpc(pc, jmptarget);
        break;
      }
      case OP_TFORCALL: {
        if (reg >= a + 2)  /* affect all regs above its base */
          setreg = filterpc(pc, jmptarget);
        break;
      }
      case OP_CALL:
      case OP_TAILCALL: {
        if (reg >= a)  /* affect all registers above base */
          setreg = filterpc(pc, jmptarget);
        break;
      }
      case OP_JMP: {
        int b = GETARG_sBx(i);
        int dest = pc + 1 + b;
        /* jump is forward and do not skip 'lastpc'? */
        if (pc < dest && dest <= lastpc) {
          if (dest > jmptarget)
            jmptarget = dest;  /* update 'jmptarget' */
        }
        break;
      }
      default:
        if (testAMode(op) && reg == a)  /* any instruction that set A */
          setreg = filterpc(pc, jmptarget);
        break;
    }
  }
  return setreg;
}